

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DrawMesh
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,DrawMeshAttribs *Attribs,
          int param_2)

{
  String *__return_storage_ptr__;
  DRAW_FLAGS DVar1;
  bool bVar2;
  COMMAND_QUEUE_TYPE CVar3;
  Char *pCVar4;
  RenderDeviceVkImpl *pRVar5;
  DeviceFeatures *pDVar6;
  PipelineStateVkImpl *pPVar7;
  PipelineStateDesc *pPVar8;
  GraphicsAdapterInfo *pGVar9;
  COMMAND_QUEUE_TYPE Type;
  char *in_R8;
  char (*in_R9) [8];
  undefined1 local_130 [8];
  string msg_6;
  string msg_5;
  string msg_4;
  string msg_3;
  undefined1 local_90 [8];
  string msg_2;
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  int param_2_local;
  DrawMeshAttribs *Attribs_local;
  DeviceContextBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._12_4_ = param_2;
  DVar1 = Diligent::operator&(Attribs->Flags,DRAW_FLAG_VERIFY_DRAW_ATTRIBS);
  if (DVar1 != DRAW_FLAG_NONE) {
    if ((this->m_Desc).QueueType == COMMAND_QUEUE_TYPE_UNKNOWN) {
      bVar2 = IsDeferred(this);
      if (!bVar2) {
        FormatString<char[79]>
                  ((string *)local_40,
                   (char (*) [79])
                   "Queue type may never be unknown for immediate contexts. This looks like a bug.")
        ;
        pCVar4 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar4,"DrawMesh",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0x90b);
        std::__cxx11::string::~string((string *)local_40);
      }
      FormatString<char[97]>
                ((string *)((long)&msg_2.field_2 + 8),
                 (char (*) [97])
                 "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
                );
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"DrawMesh",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x90b);
      std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
    }
    CVar3 = Diligent::operator&((this->m_Desc).QueueType,COMMAND_QUEUE_TYPE_GRAPHICS);
    if (CVar3 != COMMAND_QUEUE_TYPE_GRAPHICS) {
      __return_storage_ptr__ = (String *)((long)&msg_3.field_2 + 8);
      GetCommandQueueTypeString_abi_cxx11_
                (__return_storage_ptr__,(Diligent *)(ulong)(this->m_Desc).QueueType,Type);
      in_R8 = " queue.";
      FormatString<char[9],char[22],std::__cxx11::string,char[8]>
                ((string *)local_90,(Diligent *)"DrawMesh",(char (*) [9])0xcc2999,
                 (char (*) [22])__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",
                 in_R9);
      std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"DrawMesh",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x90b);
      std::__cxx11::string::~string((string *)local_90);
    }
    pRVar5 = RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::operator->(&this->m_pDevice);
    pDVar6 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetFeatures
                       ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)pRVar5);
    if (pDVar6->MeshShaders == DEVICE_FEATURE_STATE_DISABLED) {
      FormatString<char[56]>
                ((string *)((long)&msg_4.field_2 + 8),
                 (char (*) [56])"DrawMesh: mesh shaders are not supported by this device");
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"DrawMesh",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x90d);
      std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
    }
    bVar2 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator!(&this->m_pPipelineState);
    if (bVar2) {
      FormatString<char[68]>
                ((string *)((long)&msg_5.field_2 + 8),
                 (char (*) [68])
                 "DrawMesh command arguments are invalid: no pipeline state is bound.");
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"DrawMesh",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x90f);
      std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
    }
    pPVar7 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->(&this->m_pPipelineState);
    pPVar8 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetDesc
                       (&pPVar7->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
    if (pPVar8->PipelineType != PIPELINE_TYPE_MESH) {
      pPVar7 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->(&this->m_pPipelineState);
      pPVar8 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetDesc
                         (&pPVar7->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
      FormatString<char[57],char_const*,char[26]>
                ((string *)((long)&msg_6.field_2 + 8),
                 (Diligent *)"DrawMesh command arguments are invalid: pipeline state \'",
                 (char (*) [57])pPVar8,(char **)"\' is not a mesh pipeline.",(char (*) [26])in_R8);
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"DrawMesh",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x913);
      std::__cxx11::string::~string((string *)(msg_6.field_2._M_local_buf + 8));
    }
    pRVar5 = RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::operator->(&this->m_pDevice);
    pGVar9 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetAdapterInfo
                       ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)pRVar5);
    bVar2 = VerifyDrawMeshAttribs(&pGVar9->MeshShader,Attribs);
    if (!bVar2) {
      FormatString<char[28]>((string *)local_130,(char (*) [28])"DrawMeshAttribs are invalid");
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"DrawMesh",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x915);
      std::__cxx11::string::~string((string *)local_130);
    }
  }
  (this->m_Stats).CommandCounters.DrawMesh = (this->m_Stats).CommandCounters.DrawMesh + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::DrawMesh(const DrawMeshAttribs& Attribs, int)
{
#ifdef DILIGENT_DEVELOPMENT
    if ((Attribs.Flags & DRAW_FLAG_VERIFY_DRAW_ATTRIBS) != 0)
    {
        DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "DrawMesh");

        DEV_CHECK_ERR(m_pDevice->GetFeatures().MeshShaders, "DrawMesh: mesh shaders are not supported by this device");

        DEV_CHECK_ERR(m_pPipelineState, "DrawMesh command arguments are invalid: no pipeline state is bound.");

        DEV_CHECK_ERR(m_pPipelineState->GetDesc().PipelineType == PIPELINE_TYPE_MESH,
                      "DrawMesh command arguments are invalid: pipeline state '",
                      m_pPipelineState->GetDesc().Name, "' is not a mesh pipeline.");

        DEV_CHECK_ERR(VerifyDrawMeshAttribs(m_pDevice->GetAdapterInfo().MeshShader, Attribs), "DrawMeshAttribs are invalid");
    }
#endif
    ++m_Stats.CommandCounters.DrawMesh;
}